

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O3

void google::protobuf::compiler::annotation_test_util::FindAnnotationsOnPath
               (GeneratedCodeInfo *info,string *source_file,vector<int,_std::allocator<int>_> *path,
               vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
               *annotations)

{
  size_t __n;
  iterator __position;
  int iVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>_>
  *pVVar2;
  undefined8 *puVar3;
  const_reference piVar4;
  pointer piVar5;
  pointer piVar6;
  ulong uVar7;
  int index;
  Annotation *annotation;
  GeneratedCodeInfo_Annotation *local_40;
  vector<google::protobuf::GeneratedCodeInfo_Annotation_const*,std::allocator<google::protobuf::GeneratedCodeInfo_Annotation_const*>>
  *local_38;
  
  if (0 < *(int *)((long)&info->field_0 + 8)) {
    index = 0;
    local_38 = (vector<google::protobuf::GeneratedCodeInfo_Annotation_const*,std::allocator<google::protobuf::GeneratedCodeInfo_Annotation_const*>>
                *)annotations;
    do {
      pVVar2 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::GeneratedCodeInfo_Annotation>>
                         ((RepeatedPtrFieldBase *)&(info->field_0)._impl_,index);
      puVar3 = (undefined8 *)
               ((ulong)(pVVar2->field_0)._impl_.source_file_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      __n = puVar3[1];
      local_40 = pVVar2;
      if ((__n == source_file->_M_string_length) &&
         ((__n == 0 ||
          (iVar1 = bcmp((void *)*puVar3,(source_file->_M_dataplus)._M_p,__n), iVar1 == 0)))) {
        iVar1 = internal::SooRep::size
                          (&(pVVar2->field_0)._impl_.path_.soo_rep_,
                           (undefined1  [56])
                           ((undefined1  [56])pVVar2->field_0 & (undefined1  [56])0x4) ==
                           (undefined1  [56])0x0);
        piVar6 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar5 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((long)piVar5 - (long)piVar6 >> 2 == (long)iVar1) {
          if (piVar5 == piVar6) {
            uVar7 = 0;
            piVar6 = piVar5;
          }
          else {
            uVar7 = 0;
            do {
              piVar4 = RepeatedField<int>::Get(&(local_40->field_0)._impl_.path_,(int)uVar7);
              piVar5 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              piVar6 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
              if (*piVar4 != piVar5[uVar7]) break;
              uVar7 = uVar7 + 1;
            } while (uVar7 < (ulong)((long)piVar6 - (long)piVar5 >> 2));
          }
          if ((long)piVar6 - (long)piVar5 >> 2 == uVar7) {
            __position._M_current = *(GeneratedCodeInfo_Annotation ***)(local_38 + 8);
            if (__position._M_current == *(GeneratedCodeInfo_Annotation ***)(local_38 + 0x10)) {
              std::
              vector<google::protobuf::GeneratedCodeInfo_Annotation_const*,std::allocator<google::protobuf::GeneratedCodeInfo_Annotation_const*>>
              ::_M_realloc_insert<google::protobuf::GeneratedCodeInfo_Annotation_const*const&>
                        (local_38,__position,&local_40);
            }
            else {
              *__position._M_current = local_40;
              *(long *)(local_38 + 8) = *(long *)(local_38 + 8) + 8;
            }
          }
        }
      }
      index = index + 1;
    } while (index < *(int *)((long)&info->field_0 + 8));
  }
  return;
}

Assistant:

void FindAnnotationsOnPath(
    const GeneratedCodeInfo& info, const std::string& source_file,
    const std::vector<int>& path,
    std::vector<const GeneratedCodeInfo::Annotation*>* annotations) {
  for (int i = 0; i < info.annotation_size(); ++i) {
    const GeneratedCodeInfo::Annotation* annotation = &info.annotation(i);
    if (annotation->source_file() != source_file ||
        annotation->path_size() != path.size()) {
      continue;
    }
    int node = 0;
    for (; node < path.size(); ++node) {
      if (annotation->path(node) != path[node]) {
        break;
      }
    }
    if (node == path.size()) {
      annotations->push_back(annotation);
    }
  }
}